

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v8::detail::format_decimal<char,unsigned_long>(char *out,unsigned_long value,int size)

{
  format_decimal_result<char_*> fVar1;
  int iVar2;
  char *pcVar3;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  char *end;
  uint64_t in_stack_000000d0;
  bool local_45;
  int local_44;
  ulong local_40;
  char *local_38;
  char *local_30;
  
  local_44 = in_EDX;
  local_40 = in_RSI;
  local_38 = (char *)in_RDI;
  iVar2 = count_digits(in_stack_000000d0);
  local_45 = iVar2 <= in_EDX;
  ignore_unused<bool,char[20]>(&local_45,(char (*) [20])"invalid digit count");
  pcVar3 = (char *)((long)local_38 + (long)local_44);
  local_38 = pcVar3;
  for (; 99 < local_40; local_40 = local_40 / 100) {
    local_38 = local_38 + -2;
    *(undefined2 *)local_38 = *(undefined2 *)(basic_data<void>::digits + (local_40 % 100) * 2);
  }
  if (local_40 < 10) {
    local_30 = local_38 + -1;
    local_38[-1] = (char)local_40 + '0';
  }
  else {
    local_30 = local_38 + -2;
    *(undefined2 *)local_30 = *(undefined2 *)(basic_data<void>::digits + local_40 * 2);
  }
  fVar1.end = pcVar3;
  fVar1.begin = local_30;
  return fVar1;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  if (is_constant_evaluated()) {
    while (value >= 10) {
      *--out = static_cast<Char>('0' + value % 10);
      value /= 10;
    }
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, data::digits[value % 100]);
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, data::digits[value]);
  return {out, end};
}